

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<pstore::address> *
testing::internal::ActionResultHolder<pstore::address>::
PerformDefaultAction<pstore::address(unsigned_long,unsigned_int)>
          (FunctionMocker<pstore::address_(unsigned_long,_unsigned_int)> *func_mocker,
          ArgumentTuple *args,string *call_description)

{
  ActionResultHolder<pstore::address> *pAVar1;
  Result RVar2;
  
  pAVar1 = (ActionResultHolder<pstore::address> *)operator_new(0x10);
  RVar2 = FunctionMocker<pstore::address_(unsigned_long,_unsigned_int)>::PerformDefaultAction
                    (func_mocker,args,call_description);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_002714f8;
  (pAVar1->result_).value_.a_ = RVar2.a_;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }